

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O0

void __thiscall
Memory::HeapPageAllocator<Memory::PreReservedVirtualAllocWrapper>::ReleaseDecommitted
          (HeapPageAllocator<Memory::PreReservedVirtualAllocWrapper> *this,void *address,
          size_t pageCount,void *segmentParam)

{
  code *pcVar1;
  bool bVar2;
  char *pcVar3;
  undefined4 *puVar4;
  size_t sVar5;
  SegmentBase<Memory::PreReservedVirtualAllocWrapper> *segment;
  void *segmentParam_local;
  size_t pageCount_local;
  void *address_local;
  HeapPageAllocator<Memory::PreReservedVirtualAllocWrapper> *this_local;
  
  if ((this->
      super_PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
      ).maxAllocPageCount < pageCount) {
    pcVar3 = SegmentBase<Memory::PreReservedVirtualAllocWrapper>::GetAddress
                       ((SegmentBase<Memory::PreReservedVirtualAllocWrapper> *)segmentParam);
    if ((char *)address != pcVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                         ,0xa11,"(address == segment->GetAddress())",
                         "address == segment->GetAddress()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    sVar5 = SegmentBase<Memory::PreReservedVirtualAllocWrapper>::GetAvailablePageCount
                      ((SegmentBase<Memory::PreReservedVirtualAllocWrapper> *)segmentParam);
    if (pageCount != sVar5) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                         ,0xa12,"(pageCount == segment->GetAvailablePageCount())",
                         "pageCount == segment->GetAvailablePageCount()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    ReleaseDecommittedSegment
              (this,(SegmentBase<Memory::PreReservedVirtualAllocWrapper> *)segmentParam);
  }
  else {
    if (0xffffffff < pageCount) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                         ,0xa17,"(pageCount <= (2147483647 *2U +1U))","pageCount <= UINT_MAX");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    TrackDecommittedPages(this,address,(uint)pageCount,segmentParam);
  }
  return;
}

Assistant:

void
HeapPageAllocator<T>::ReleaseDecommitted(void * address, size_t pageCount, __in void *  segmentParam)
{
    SegmentBase<T> * segment = (SegmentBase<T>*) segmentParam;
    if (pageCount > this->maxAllocPageCount)
    {
        Assert(address == segment->GetAddress());
        Assert(pageCount == segment->GetAvailablePageCount());
        this->ReleaseDecommittedSegment(segment);
    }
    else
    {
        Assert(pageCount <= UINT_MAX);
        this->TrackDecommittedPages(address, (uint)pageCount, (PageSegment *)segment);
    }
}